

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

string * __thiscall
clipp::usage_lines::param_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,parameter *p,context *cur)

{
  uint uVar1;
  pointer pcVar2;
  group *pgVar3;
  pointer pcVar4;
  pointer pbVar5;
  pointer pbVar6;
  long *plVar7;
  undefined7 extraout_var;
  undefined8 *puVar8;
  long *plVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  string lbl;
  _Alloc_hider local_a0;
  size_type local_98;
  char local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  uint local_5c;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = (cur->pos).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pgVar3 = pcVar2[-1].parent;
  pcVar4 = (pgVar3->children_).
           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar14 = true;
  if (((1 < (ulong)(((long)(pgVar3->children_).
                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4 >> 3) *
                   0xf83e0f83e0f83e1)) && ((p->super_token<clipp::parameter>).blocking_ == true)) &&
     ((cur->pos).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != pcVar2)) {
    bVar14 = pcVar2[-1].cur._M_current != pcVar4;
  }
  bVar13 = this->ommitOutermostSurrounders_ ^ 1U | cur->outermost != pgVar3;
  if (pgVar3->exclusive_ == false) {
    bVar10 = (p->required_ ^ 1U) & bVar14 & bVar13;
  }
  else {
    bVar10 = 0;
  }
  bVar13 = bVar13 & (p->super_token<clipp::parameter>).repeatable_;
  local_a0._M_p = &local_90;
  local_98 = 0;
  local_90 = '\0';
  if (bVar13 == 1) {
    std::__cxx11::string::_M_append
              ((char *)&local_a0,(ulong)(this->fmt_).repeatPre_._M_dataplus._M_p);
  }
  if (bVar10 != 0) {
    std::__cxx11::string::_M_append
              ((char *)&local_a0,(ulong)(this->fmt_).optionPre_._M_dataplus._M_p);
  }
  pbVar5 = (p->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (p->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 == pbVar6) {
    if ((p->label_)._M_string_length == 0) {
      if ((this->fmt_).emptyLabel_._M_string_length == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_0013d0ce;
      }
      std::operator+(&local_50,&(this->fmt_).labelPre_,&(this->fmt_).emptyLabel_);
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_50,(ulong)(this->fmt_).labelPst_._M_dataplus._M_p);
      local_80 = &local_70;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_70 = *plVar7;
        lStack_68 = puVar8[3];
      }
      else {
        local_70 = *plVar7;
        local_80 = (long *)*puVar8;
      }
      local_78 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
    }
    else {
      std::operator+(&local_50,&(this->fmt_).labelPre_,&p->label_);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)(this->fmt_).labelPst_._M_dataplus._M_p);
      local_80 = &local_70;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_70 = *plVar9;
        lStack_68 = plVar7[3];
      }
      else {
        local_70 = *plVar9;
        local_80 = (long *)*plVar7;
      }
      local_78 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    uVar1 = (this->fmt_).maxAltInUsage_;
    uVar11 = (uint)((ulong)((long)pbVar6 - (long)pbVar5) >> 5);
    if ((int)uVar1 < (int)uVar11) {
      uVar11 = uVar1;
    }
    if ((int)uVar11 < 2 || bVar10 != 0) {
      local_5c = 0;
    }
    else {
      bVar14 = context::is_singleton(cur);
      local_5c = (uint)CONCAT71(extraout_var,bVar14) ^ 1;
    }
    local_58 = __return_storage_ptr__;
    if ((char)local_5c != '\0') {
      std::__cxx11::string::_M_append
                ((char *)&local_a0,(ulong)(this->fmt_).alternFlagPre_._M_dataplus._M_p);
    }
    if (0 < (int)uVar11) {
      lVar12 = 0;
      bVar14 = false;
      do {
        if (bVar14) {
          bVar14 = context::is_singleton(cur);
          std::__cxx11::string::_M_append
                    ((char *)&local_a0,(ulong)(&(this->fmt_).altGroupSep_)[!bVar14]._M_dataplus._M_p
                    );
        }
        std::__cxx11::string::_M_append
                  ((char *)&local_a0,
                   *(ulong *)((long)&(((p->flags_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar12));
        lVar12 = lVar12 + 0x20;
        bVar14 = true;
      } while ((ulong)uVar11 << 5 != lVar12);
    }
    __return_storage_ptr__ = local_58;
    if ((char)local_5c != '\0') {
      std::__cxx11::string::_M_append
                ((char *)&local_a0,(ulong)(this->fmt_).alternFlagPst_._M_dataplus._M_p);
    }
  }
  if (bVar10 != 0) {
    std::__cxx11::string::_M_append
              ((char *)&local_a0,(ulong)(this->fmt_).optionPst_._M_dataplus._M_p);
  }
  if (bVar13 != 0) {
    std::__cxx11::string::_M_append
              ((char *)&local_a0,(ulong)(this->fmt_).repeatPst_._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_a0._M_p == &local_90) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_8f,local_90);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_88;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_a0._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_8f,local_90);
  }
  __return_storage_ptr__->_M_string_length = local_98;
  local_98 = 0;
  local_90 = '\0';
  local_a0._M_p = &local_90;
LAB_0013d0ce:
  if (local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string param_label(const parameter& p, const context& cur) const
    {
        const auto& parent = cur.pos.parent();

        const bool startsOptionalSequence =
            parent.size() > 1 && p.blocking() && cur.pos.is_first_in_parent();

        const bool outermost =
            ommitOutermostSurrounders_ && cur.outermost == &parent;

        const bool showopt = !cur.is_alternative() && !p.required()
            && !startsOptionalSequence && !outermost;

        const bool showrep = p.repeatable() && !outermost;

        string lbl;

        if(showrep) lbl += fmt_.repeat_prefix();
        if(showopt) lbl += fmt_.optional_prefix();

        const auto& flags = p.flags();
        if(!flags.empty()) {
            const int n = std::min(fmt_.max_flags_per_param_in_usage(),
                                   int(flags.size()));

            const bool surrAlt = n > 1 && !showopt && !cur.is_singleton();

            if(surrAlt) lbl += fmt_.alternative_flags_prefix();
            bool sep = false;
            for(int i = 0; i < n; ++i) {
                if(sep) {
                    if(cur.is_singleton())
                        lbl += fmt_.alternative_group_separator();
                    else
                        lbl += fmt_.flag_separator();
                }
                lbl += flags[i];
                sep = true;
            }
            if(surrAlt) lbl += fmt_.alternative_flags_postfix();
        }
        else {
             if(!p.label().empty()) {
                 lbl += fmt_.label_prefix()
                     + p.label()
                     + fmt_.label_postfix();
             } else if(!fmt_.empty_label().empty()) {
                 lbl += fmt_.label_prefix()
                     + fmt_.empty_label()
                     + fmt_.label_postfix();
             } else {
                 return "";
             }
        }

        if(showopt) lbl += fmt_.optional_postfix();
        if(showrep) lbl += fmt_.repeat_postfix();

        return lbl;
    }